

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sastoken.c
# Opt level: O3

STRING_HANDLE
SASToken_Create(STRING_HANDLE key,STRING_HANDLE scope,STRING_HANDLE keyName,uint64_t expiry)

{
  LOGGER_LOG p_Var1;
  char *key_00;
  char *scope_00;
  char *keyname;
  STRING_HANDLE pSVar2;
  
  if (key == (STRING_HANDLE)0x0 || scope == (STRING_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/sastoken.c"
                ,"SASToken_Create",0x140,1,
                "Invalid Parameter to SASToken_Create. handle key: %p, handle scope: %p, handle keyName: %p"
                ,key,scope,keyName);
    }
    return (STRING_HANDLE)0x0;
  }
  key_00 = STRING_c_str(key);
  scope_00 = STRING_c_str(scope);
  keyname = STRING_c_str(keyName);
  pSVar2 = construct_sas_token(key_00,scope_00,keyname,expiry);
  return pSVar2;
}

Assistant:

STRING_HANDLE SASToken_Create(STRING_HANDLE key, STRING_HANDLE scope, STRING_HANDLE keyName, uint64_t expiry)
{
    STRING_HANDLE result;

    /*Codes_SRS_SASTOKEN_06_001: [If key is NULL then SASToken_Create shall return NULL.]*/
    /*Codes_SRS_SASTOKEN_06_003: [If scope is NULL then SASToken_Create shall return NULL.]*/
    /*Codes_SRS_SASTOKEN_06_007: [keyName is optional and can be set to NULL.]*/
    if ((key == NULL) ||
        (scope == NULL))
    {
        LogError("Invalid Parameter to SASToken_Create. handle key: %p, handle scope: %p, handle keyName: %p", key, scope, keyName);
        result = NULL;
    }
    else
    {
        const char* string_key = STRING_c_str(key);
        const char* string_scope = STRING_c_str(scope);
        const char* string_name = STRING_c_str(keyName);
        result = construct_sas_token(string_key, string_scope, string_name, expiry);
    }
    return result;
}